

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int lj_cf_jit_profile_dumpstack(lua_State *L)

{
  int32_t depth_00;
  GCstr *pGVar1;
  char *str;
  char *p;
  GCstr *fmt;
  size_t sStack_28;
  int depth;
  size_t len;
  lua_State *plStack_18;
  int arg;
  lua_State *L2;
  lua_State *L_local;
  
  len._4_4_ = 0;
  plStack_18 = L;
  if ((L->base < L->top) && ((int)(L->base->field_4).it >> 0xf == -7)) {
    plStack_18 = (lua_State *)(L->base->u64 & 0x7fffffffffff);
    len._4_4_ = 1;
  }
  L2 = L;
  pGVar1 = lj_lib_checkstr(L,len._4_4_ + 1);
  depth_00 = lj_lib_checkint(L2,len._4_4_ + 2);
  str = luaJIT_profile_dumpstack(plStack_18,(char *)(pGVar1 + 1),depth_00,&stack0xffffffffffffffd8);
  lua_pushlstring(L2,str,sStack_28);
  return 1;
}

Assistant:

LJLIB_CF(jit_profile_dumpstack)
{
  lua_State *L2 = L;
  int arg = 0;
  size_t len;
  int depth;
  GCstr *fmt;
  const char *p;
  if (L->top > L->base && tvisthread(L->base)) {
    L2 = threadV(L->base);
    arg = 1;
  }
  fmt = lj_lib_checkstr(L, arg+1);
  depth = lj_lib_checkint(L, arg+2);
  p = luaJIT_profile_dumpstack(L2, strdata(fmt), depth, &len);
  lua_pushlstring(L, p, len);
  return 1;
}